

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O2

void __thiscall TPZIntCube3D::Point(TPZIntCube3D *this,int ip,TPZVec<double> *pos,REAL *w)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ostream *poVar6;
  int i;
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  bool bVar7;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  
  if (this->fIntZeta == (TPZGaussRule *)0x0) {
    bVar7 = true;
  }
  else if (this->fIntEta == (TPZGaussRule *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = false;
    if ((-1 < ip) && (bVar7 = false, this->fIntKsi != (TPZGaussRule *)0x0)) {
      iVar5 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this);
      if (ip < iVar5) {
        iVar5 = this->fIntKsi->fNumInt;
        lVar1 = (long)(this->fIntEta->fNumInt * iVar5);
        uVar2 = (long)ip / lVar1;
        uVar4 = (long)ip % lVar1;
        uVar4 = (ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff;
        uVar3 = (long)uVar4 / (long)iVar5;
        TPZGaussRule::Loc((longdouble *)this->fIntKsi,
                          (TPZGaussRule *)((long)ip % (long)iVar5 & 0xffffffff),
                          (int)((long)uVar4 % (long)iVar5));
        *pos->fStore = (double)in_ST0;
        TPZGaussRule::Loc((longdouble *)this->fIntEta,(TPZGaussRule *)(uVar3 & 0xffffffff),i);
        pos->fStore[1] = (double)in_ST1;
        TPZGaussRule::Loc((longdouble *)this->fIntZeta,(TPZGaussRule *)(uVar2 & 0xffffffff),i_00);
        pos->fStore[2] = (double)in_ST2;
        TPZGaussRule::W((longdouble *)this->fIntKsi,
                        (TPZGaussRule *)((long)ip % (long)iVar5 & 0xffffffff),i_01);
        TPZGaussRule::W((longdouble *)this->fIntEta,(TPZGaussRule *)(uVar3 & 0xffffffff),i_02);
        TPZGaussRule::W((longdouble *)this->fIntZeta,(TPZGaussRule *)(uVar2 & 0xffffffff),i_03);
        *w = (double)(in_ST3 * in_ST4 * in_ST5);
        return;
      }
      bVar7 = this->fIntZeta == (TPZGaussRule *)0x0;
    }
  }
  if (((this->fIntKsi == (TPZGaussRule *)0x0) || (this->fIntEta == (TPZGaussRule *)0x0)) || (bVar7))
  {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Null Pointer passed to method ");
    std::operator<<(poVar6,"TPZIntCube3D::Point(..)\n");
  }
  if ((-1 < ip) && (iVar5 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this), ip < iVar5))
  {
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"ip = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,ip);
  poVar6 = std::operator<<(poVar6,", Out of Range: 0 -> ");
  iVar5 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void TPZIntCube3D::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
	if((fIntZeta) && (fIntEta) && (fIntKsi) && ((ip >= 0) && (ip < NPoints()))){
		int ik, ie , iz;
		ik = ip % fIntKsi->NInt();
		ie = (ip % (fIntKsi->NInt()*fIntEta->NInt()))/fIntKsi->NInt();
		iz = ip/(fIntKsi->NInt()*fIntEta->NInt());
		
		pos[0] 	= fIntKsi->Loc(ik);
		pos[1]	= fIntEta->Loc(ie);
		pos[2]	= fIntZeta->Loc(iz);
		w       = fIntKsi->W(ik)*fIntEta->W(ie)*fIntZeta->W(iz);
		return;
	}
	if(!fIntKsi || !fIntEta || !fIntZeta)
		PZError << "Null Pointer passed to method " << "TPZIntCube3D::Point(..)\n";
	if((ip < 0) || (ip >= NPoints()))
		PZError 	<< "ip = " << ip << ", Out of Range: 0 -> " << NPoints() << std::endl;
}